

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::
     deleteAll<std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
               (vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                *container)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (container->
            super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (container->
                 super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (IExceptionTranslator *)0x0) {
      (*(*ppIVar2)->_vptr_IExceptionTranslator[1])();
    }
  }
  return;
}

Assistant:

inline void arcSafeRelease( NSObject* obj ) {
    [obj release];
}